

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O0

string * __thiscall
flow::ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  string_view format_str;
  IPAddress *in_stack_ffffffffffffffa8;
  undefined1 local_2c [4];
  basic_string_view<char> local_28;
  undefined8 local_18;
  ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *this_local;
  
  local_18 = this;
  this_local = (ConstantValue<flow::util::IPAddress,_(flow::LiteralType)5> *)__return_storage_ptr__;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_28,"Constant \'{}\': {} = {}");
  psVar1 = Value::name_abi_cxx11_((Value *)this);
  local_2c = (undefined1  [4])Value::type((Value *)this);
  format_str.size_ = (size_t)psVar1;
  format_str.data_ = (char *)local_28.size_;
  fmt::v5::format<std::__cxx11::string,flow::LiteralType,flow::util::IPAddress>
            (__return_storage_ptr__,(v5 *)local_28.data_,format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c,
             (LiteralType *)((long)this + 0x48),in_stack_ffffffffffffffa8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override {
    return fmt::format("Constant '{}': {} = {}", name(), type(), value_);
  }